

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneobject.cpp
# Opt level: O2

void __thiscall SceneObject::SceneObject(SceneObject *this,mat4 *ltw,ColorRGB c)

{
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_78;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_60 [4];
  
  this->_vptr_SceneObject = (_func_int **)&PTR__SceneObject_0010bd60;
  ColorRGB::ColorRGB(&this->color);
  *(undefined8 *)&(this->position).field_0 = 0;
  *(undefined8 *)((long)&(this->position).field_0 + 8) = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->localToWorld).value[0].field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->localToWorld).value[0].field_0 + 0xc) = 0;
  (this->localToWorld).value[1].field_0.field_0.y = 1.0;
  *(undefined8 *)((long)&(this->localToWorld).value[1].field_0 + 8) = 0;
  *(undefined8 *)&(this->localToWorld).value[2].field_0 = 0;
  (this->localToWorld).value[2].field_0.field_0.z = 1.0;
  *(undefined8 *)((long)&(this->localToWorld).value[2].field_0 + 0xc) = 0;
  *(undefined8 *)((long)&(this->localToWorld).value[3].field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->localToWorld).value[3].field_0 + 0xc) = 0x3f8000003f800000;
  *(undefined8 *)((long)&(this->worldToLocal).value[0].field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->worldToLocal).value[0].field_0 + 0xc) = 0;
  (this->worldToLocal).value[1].field_0.field_0.y = 1.0;
  *(undefined8 *)((long)&(this->worldToLocal).value[1].field_0 + 8) = 0;
  *(undefined8 *)&(this->worldToLocal).value[2].field_0 = 0;
  (this->worldToLocal).value[2].field_0.field_0.z = 1.0;
  *(undefined8 *)((long)&(this->worldToLocal).value[2].field_0 + 0xc) = 0;
  *(undefined8 *)((long)&(this->worldToLocal).value[3].field_0 + 4) = 0;
  (this->worldToLocal).value[3].field_0.field_0.w = 1.0;
  glm::detail::tmat4x4<float>::operator=(&this->localToWorld,ltw);
  glm::inverse<float>((tmat4x4<float> *)&local_60[0].field_0,ltw);
  glm::detail::tmat4x4<float>::operator=(&this->worldToLocal,(tmat4x4<float> *)&local_60[0].field_0)
  ;
  (this->color).r = (float)(int)c._0_8_;
  (this->color).g = (float)(int)((ulong)c._0_8_ >> 0x20);
  (this->color).b = c.b;
  local_78._0_8_ = 0;
  local_78._8_8_ = 0x3f80000000000000;
  glm::detail::operator*(ltw,(row_type *)&local_78.field_0);
  *(undefined8 *)&(this->position).field_0 = local_60[0]._0_8_;
  (this->position).field_0.field_0.z = (value_type)local_60[0]._8_4_;
  return;
}

Assistant:

SceneObject::SceneObject(const glm::mat4 &ltw, ColorRGB c) {
    localToWorld = ltw;
    worldToLocal = glm::inverse(ltw);
    color = c;
    
    position = glm::vec3(ltw * glm::vec4(0, 0, 0, 1)); //poor mans swizzling
}